

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall FBlockThingsIterator::StartBlock(FBlockThingsIterator *this,int x,int y)

{
  FBlockNode *pFVar1;
  
  this->curx = x;
  this->cury = y;
  if ((y | x) < 0) {
    pFVar1 = (FBlockNode *)0x0;
  }
  else {
    pFVar1 = (FBlockNode *)0x0;
    if ((x < bmapwidth) && (y < bmapheight)) {
      pFVar1 = blocklinks[(uint)(bmapwidth * y + x)];
    }
  }
  this->block = pFVar1;
  return;
}

Assistant:

void FBlockThingsIterator::StartBlock(int x, int y) 
{ 
	curx = x; 
	cury = y; 
	if (x >= 0 && y >= 0 && x < bmapwidth && y <bmapheight)
	{
		block = blocklinks[y*bmapwidth + x];
	}
	else
	{
		// invalid block
		block = NULL;
	}
}